

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void L16toGry(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  long lVar3;
  double dVar4;
  
  puVar1 = sp->tbuf;
  lVar3 = 0;
  for (; 0 < n; n = n + -1) {
    dVar4 = LogL16toY((int)*(short *)(puVar1 + lVar3 * 2));
    if (dVar4 <= 0.0) {
      uVar2 = '\0';
    }
    else {
      uVar2 = 0xff;
      if (dVar4 < 1.0) {
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        uVar2 = (uint8_t)(int)(dVar4 * 256.0);
      }
    }
    op[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

static void L16toGry(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    int16_t *l16 = (int16_t *)sp->tbuf;
    uint8_t *gp = (uint8_t *)op;

    while (n-- > 0)
    {
        double Y = LogL16toY(*l16++);
        *gp++ = (uint8_t)((Y <= 0.)   ? 0
                          : (Y >= 1.) ? 255
                                      : (int)(256. * sqrt(Y)));
    }
}